

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMLoc.h
# Opt level: O3

bool __thiscall llvm::SMFixIt::operator<(SMFixIt *this,SMFixIt *Other)

{
  char *pcVar1;
  char *pcVar2;
  byte extraout_var;
  bool bVar3;
  
  pcVar1 = (Other->Range).Start.Ptr;
  pcVar2 = (this->Range).Start.Ptr;
  bVar3 = pcVar2 < pcVar1;
  if (pcVar2 == pcVar1) {
    pcVar1 = (Other->Range).End.Ptr;
    pcVar2 = (this->Range).End.Ptr;
    bVar3 = pcVar2 < pcVar1;
    if (pcVar2 == pcVar1) {
      std::__cxx11::string::compare((string *)&this->Text);
      return (bool)(extraout_var >> 7);
    }
  }
  return bVar3;
}

Assistant:

const char *getPointer() const { return Ptr; }